

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_667a22::FilterRegex
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool includeMatches,string *listName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varArgsExpanded,cmExecutionStatus *status)

{
  string_view value_00;
  bool bVar1;
  const_reference s;
  iterator __first;
  iterator __last;
  cmMakefile *this;
  MatchesRegex __pred;
  string_view local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_210;
  undefined1 local_200 [8];
  string value;
  undefined1 local_1d8;
  undefined3 uStack_1d7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newArgsEnd;
  iterator argsEnd;
  iterator argsBegin;
  cmAlphaNum local_1a0;
  cmAlphaNum local_160;
  undefined1 local_130 [8];
  string error;
  RegularExpression regex;
  string *pattern;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *varArgsExpanded_local;
  string *listName_local;
  bool includeMatches_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  s = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,4);
  cmsys::RegularExpression::RegularExpression((RegularExpression *)((long)&error.field_2 + 8),s);
  bVar1 = cmsys::RegularExpression::is_valid((RegularExpression *)((long)&error.field_2 + 8));
  if (bVar1) {
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(varArgsExpanded);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(varArgsExpanded);
    MatchesRegex::MatchesRegex
              ((MatchesRegex *)((long)&value.field_2 + 8),
               (RegularExpression *)((long)&error.field_2 + 8),includeMatches);
    __pred._12_4_ = 0;
    __pred.regex = (RegularExpression *)value.field_2._8_8_;
    __pred.includeMatches = (bool)local_1d8;
    __pred._9_3_ = uStack_1d7;
    local_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(anonymous_namespace)::MatchesRegex>
                          (__first._M_current,__last._M_current,__pred);
    local_218 = __first._M_current;
    local_210 = cmMakeRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )__first._M_current,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_220);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_230,";");
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)local_200,&local_210,local_230);
    this = cmExecutionStatus::GetMakefile(status);
    value_00 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_200);
    cmMakefile::AddDefinition(this,listName,value_00);
    std::__cxx11::string::~string((string *)local_200);
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_160,"sub-command FILTER, mode REGEX failed to compile regex \"");
    cmAlphaNum::cmAlphaNum(&local_1a0,s);
    cmStrCat<char[3]>((string *)local_130,&local_160,&local_1a0,(char (*) [3])0xded001);
    cmExecutionStatus::SetError(status,(string *)local_130);
    std::__cxx11::string::~string((string *)local_130);
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)((long)&error.field_2 + 8));
  return bVar1;
}

Assistant:

bool FilterRegex(std::vector<std::string> const& args, bool includeMatches,
                 std::string const& listName,
                 std::vector<std::string>& varArgsExpanded,
                 cmExecutionStatus& status)
{
  const std::string& pattern = args[4];
  cmsys::RegularExpression regex(pattern);
  if (!regex.is_valid()) {
    std::string error =
      cmStrCat("sub-command FILTER, mode REGEX failed to compile regex \"",
               pattern, "\".");
    status.SetError(error);
    return false;
  }

  auto argsBegin = varArgsExpanded.begin();
  auto argsEnd = varArgsExpanded.end();
  auto newArgsEnd =
    std::remove_if(argsBegin, argsEnd, MatchesRegex(regex, includeMatches));

  std::string value = cmJoin(cmMakeRange(argsBegin, newArgsEnd), ";");
  status.GetMakefile().AddDefinition(listName, value);
  return true;
}